

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

int __thiscall BpTree<float>::FindKey(BpTree<float> *this,float k,IndexNode<float> *C)

{
  uint uVar1;
  float *pfVar2;
  float fVar3;
  pointer pcVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  Addr *pAVar8;
  size_t __n;
  long lVar9;
  bool bVar10;
  IndexNode<float> D;
  vector<float,_std::allocator<float>_> local_e8;
  _Vector_base<char,_std::allocator<char>_> local_d0;
  vector<Addr,_std::allocator<Addr>_> local_b8;
  Addr local_a0;
  Addr AStack_98;
  IndexNode<float> local_90;
  
  IndexNode<float>::IndexNode(&local_90,this->N);
  uVar6 = 0xffffffff;
  if ((this->RootAddr).FileOff != -1) {
    FindNode(this,this->RootAddr,C);
    if (C->NodeState != '1') {
      do {
        uVar6 = this->N - 1;
        uVar5 = 0;
        if (this->N < 2) {
LAB_0012c5d0:
          bVar10 = (uint)uVar5 == uVar6;
          uVar6 = (uint)uVar5;
          if (bVar10) goto LAB_0012c5d4;
          uVar5 = uVar5 & 0xffffffff;
          if ((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar5] == '0') goto LAB_0012c5e4;
          fVar3 = (C->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5];
          if ((fVar3 == k) && (!NAN(fVar3) && !NAN(k))) {
            FindNode(this,(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar5],&local_90);
            std::vector<float,_std::allocator<float>_>::vector(&local_e8,&local_90.k);
            local_d0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_d0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_d0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
                      (&local_d0,
                       (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
            pcVar4 = local_d0._M_impl.super__Vector_impl_data._M_start;
            __n = (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
            if (__n != 0) {
              memmove(local_d0._M_impl.super__Vector_impl_data._M_start,
                      local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,__n);
            }
            local_d0._M_impl.super__Vector_impl_data._M_finish = pcVar4 + __n;
            std::vector<Addr,_std::allocator<Addr>_>::vector(&local_b8,&local_90.p);
            local_a0 = local_90.parent;
            AStack_98 = local_90.self;
            uVar6 = this->N - 1;
            uVar7 = 0;
            if (this->N < 2) {
LAB_0012c705:
              lVar9 = 8;
              if ((uint)uVar7 != uVar6) {
                lVar9 = (ulong)(local_d0._M_impl.super__Vector_impl_data._M_start
                                [uVar7 & 0xffffffff] == '0') << 3;
              }
            }
            else {
              uVar7 = 0;
              do {
                if (local_d0._M_impl.super__Vector_impl_data._M_start[uVar7] != '1')
                goto LAB_0012c705;
                if ((local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7] == k) &&
                   (!NAN(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar7]) && !NAN(k))) goto LAB_0012c705;
                uVar7 = uVar7 + 1;
              } while (uVar6 != uVar7);
              lVar9 = 8;
            }
            if (local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage -
                              (long)local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl
                                    .super__Vector_impl_data._M_start);
            }
            if (local_d0._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_d0._M_impl.super__Vector_impl_data._M_start,
                              (long)local_d0._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_d0._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_e8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_e8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            pAVar8 = (Addr *)((long)&(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                     super__Vector_impl_data._M_start[uVar5].BlockNum + lVar9);
            goto LAB_0012c5ec;
          }
          if (k < fVar3) goto LAB_0012c5e4;
        }
        else {
          uVar5 = 0;
          do {
            if (((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5] != '1') ||
               (pfVar2 = (C->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar5, k < *pfVar2 || k == *pfVar2))
            goto LAB_0012c5d0;
            uVar5 = uVar5 + 1;
          } while (uVar6 != uVar5);
LAB_0012c5d4:
          uVar5 = (ulong)uVar6;
LAB_0012c5e4:
          pAVar8 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar5;
LAB_0012c5ec:
          FindNode(this,*pAVar8,C);
        }
      } while (C->NodeState != '1');
    }
    uVar1 = this->N - 1;
    uVar5 = 0;
    uVar6 = 0xffffffff;
    if (this->N < 2) {
LAB_0012c518:
      if (((uint)uVar5 != uVar1) &&
         (uVar6 = 0xffffffff,
         (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar5 & 0xffffffff] != '0')) {
        uVar6 = (uint)uVar5;
      }
    }
    else {
      uVar5 = 0;
      do {
        if ((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar5] != '1') goto LAB_0012c518;
        fVar3 = (C->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
        if ((fVar3 == k) && (!NAN(fVar3) && !NAN(k))) goto LAB_0012c518;
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
  }
  if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar6;
}

Assistant:

int BpTree<K>::FindKey(K k, IndexNode<K>& C) {
	IndexNode<K> D(N);
	int i;
	if (this->RootAddr.FileOff == -1)		return -1;	//����ǿ�����ֱ�ӷ���-1
	this->FindNode(this->RootAddr, C);
	while (C.NodeState != LEAF) {
		for (i = 0; i < N - 1 && C.v[i] == '1' && k > C.k[i]; i++);
		if (i == N - 1 || C.v[i] == '0') {
			this->FindNode(C.p[i], C);
		}
		else if (k == C.k[i]) {
			this->FindNode(C.p[i], D);
			if(this->HaveK(D, k))
				this->FindNode(C.p[i], C);			//���C.p[i]������k����C = this->FindNode(C.p[i]);
			else
				this->FindNode(C.p[i + 1], C);		//���C.p[i]������k����C = this->FindNode(C.p[i + 1]);
		}
		else if (k < C.k[i]) {
			this->FindNode(C.p[i], C);
		}
	}
	for (i = 0; i < N - 1 && C.v[i] == '1'&& k != C.k[i]; i++);
	if (i == N - 1 || C.v[i] == '0') {
		return -1;		//δ�ҵ�
	}
	else {
		return i;		//�ҵ���
	}
}